

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * print_number(cJSON *item,printbuffer *p)

{
  double __x;
  double dVar1;
  double d;
  char *str;
  printbuffer *p_local;
  cJSON *item_local;
  
  __x = item->valuedouble;
  if ((__x != 0.0) || (NAN(__x))) {
    if (((2.220446049250313e-16 < ABS((double)item->valueint - __x)) || (2147483647.0 < __x)) ||
       (__x < -2147483648.0)) {
      if (p == (printbuffer *)0x0) {
        d = (double)(*cJSON_malloc)(0x40);
      }
      else {
        d = (double)ensure(p,0x40);
      }
      if (d != 0.0) {
        if ((__x * 0.0 != 0.0) || (NAN(__x * 0.0))) {
          sprintf((char *)d,"null");
        }
        else {
          dVar1 = floor(__x);
          if ((2.220446049250313e-16 < ABS(dVar1 - __x)) || (1e+60 <= ABS(__x))) {
            if ((ABS(__x) < 1e-06) || (1000000000.0 < ABS(__x))) {
              sprintf((char *)d,"%e",__x);
            }
            else {
              sprintf((char *)d,"%f",__x);
            }
          }
          else {
            sprintf((char *)d,"%.0f",__x);
          }
        }
      }
    }
    else {
      if (p == (printbuffer *)0x0) {
        d = (double)(*cJSON_malloc)(0x15);
      }
      else {
        d = (double)ensure(p,0x15);
      }
      if (d != 0.0) {
        sprintf((char *)d,"%d",(ulong)(uint)item->valueint);
      }
    }
  }
  else {
    if (p == (printbuffer *)0x0) {
      d = (double)(*cJSON_malloc)(2);
    }
    else {
      d = (double)ensure(p,2);
    }
    if (d != 0.0) {
      strcpy((char *)d,"0");
    }
  }
  return (char *)d;
}

Assistant:

static char *print_number(cJSON *item,printbuffer *p)
{
	char *str=0;
	double d=item->valuedouble;
	if (d==0)
	{
		if (p)	str=ensure(p,2);
		else	str=(char*)cJSON_malloc(2);	/* special case for 0. */
		if (str) strcpy(str,"0");
	}
	else if (fabs(((double)item->valueint)-d)<=DBL_EPSILON && d<=INT_MAX && d>=INT_MIN)
	{
		if (p)	str=ensure(p,21);
		else	str=(char*)cJSON_malloc(21);	/* 2^64+1 can be represented in 21 chars. */
		if (str)	sprintf(str,"%d",item->valueint);
	}
	else
	{
		if (p)	str=ensure(p,64);
		else	str=(char*)cJSON_malloc(64);	/* This is a nice tradeoff. */
		if (str)
		{
			if (d*0!=0)													sprintf(str,"null");	/* This checks for NaN and Infinity */
			else if (fabs(floor(d)-d)<=DBL_EPSILON && fabs(d)<1.0e60)	sprintf(str,"%.0f",d);
			else if (fabs(d)<1.0e-6 || fabs(d)>1.0e9)					sprintf(str,"%e",d);
			else														sprintf(str,"%f",d);
		}
	}
	return str;
}